

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::SetupAddressRelay
          (PeerManagerImpl *this,CNode *node,Peer *peer)

{
  byte bVar1;
  int iVar2;
  CRollingBloomFilter *__ptr_00;
  CRollingBloomFilter *this_00;
  pointer *__ptr;
  pointer __p;
  long in_FS_OFFSET;
  CRollingBloomFilter *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)&(this->m_peer_map)._M_t._M_impl.field_0x4;
  if (iVar2 != 4) {
    LOCK();
    bVar1 = (node->addr).super_CService.super_CNetAddr.m_addr._union.direct[0];
    (node->addr).super_CService.super_CNetAddr.m_addr._union.direct[0] = '\x01';
    UNLOCK();
    if ((bVar1 & 1) == 0) {
      this_00 = (CRollingBloomFilter *)operator_new(0x30);
      CRollingBloomFilter::CRollingBloomFilter(this_00,5000,0.001);
      local_28 = (CRollingBloomFilter *)0x0;
      __ptr_00 = (CRollingBloomFilter *)(node->m_connected).__r;
      (node->m_connected).__r = (rep)this_00;
      if (__ptr_00 != (CRollingBloomFilter *)0x0) {
        std::default_delete<CRollingBloomFilter>::operator()
                  ((default_delete<CRollingBloomFilter> *)&node->m_connected,__ptr_00);
      }
      if (local_28 != (CRollingBloomFilter *)0x0) {
        std::default_delete<CRollingBloomFilter>::operator()
                  ((default_delete<CRollingBloomFilter> *)&local_28,local_28);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2 != 4;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::SetupAddressRelay(const CNode& node, Peer& peer)
{
    // We don't participate in addr relay with outbound block-relay-only
    // connections to prevent providing adversaries with the additional
    // information of addr traffic to infer the link.
    if (node.IsBlockOnlyConn()) return false;

    if (!peer.m_addr_relay_enabled.exchange(true)) {
        // During version message processing (non-block-relay-only outbound peers)
        // or on first addr-related message we have received (inbound peers), initialize
        // m_addr_known.
        peer.m_addr_known = std::make_unique<CRollingBloomFilter>(5000, 0.001);
    }

    return true;
}